

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRoots.cpp
# Opt level: O2

void sort(int nx,double *x0,double *x1,double *x2)

{
  double __tmp;
  double dVar1;
  double dVar2;
  
  if (nx == 3) {
    dVar2 = *x0;
    dVar1 = *x1;
    if (dVar1 < dVar2) {
      *x0 = dVar1;
      *x1 = dVar2;
      dVar1 = dVar2;
    }
    if (*x2 < dVar1) {
      *x1 = *x2;
      *x2 = dVar1;
      dVar1 = *x1;
    }
    dVar2 = *x0;
  }
  else {
    if (nx != 2) {
      return;
    }
    dVar2 = *x0;
    dVar1 = *x1;
  }
  if (dVar1 < dVar2) {
    *x0 = dVar1;
    *x1 = dVar2;
  }
  return;
}

Assistant:

void
sort (int nx, double& x0, double& x1, double& x2)
{
    if (nx == 2)
    {
        if (x0 > x1) swap (x0, x1);
    }

    if (nx == 3)
    {
        if (x0 > x1) swap (x0, x1);
        if (x1 > x2) swap (x1, x2);
        if (x0 > x1) swap (x0, x1);
    }
}